

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

optional<spv::Capability>
spvtools::opt::Handler_OpTypePointer_StorageUniform16(Instruction *instruction)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  FeatureManager *feature_manager;
  DecorationManager *this;
  DefUseManager *this_00;
  _Elt_pointer puVar4;
  Instruction *this_01;
  ulong uVar5;
  long lVar6;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
  instructions_to_visit;
  
  if (instruction->opcode_ != OpTypePointer) {
    __assert_fail("instruction->opcode() == spv::Op::OpTypePointer && \"This handler only support OpTypePointer opcodes.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                  ,0xf7,
                  "std::optional<spv::Capability> spvtools::opt::Handler_OpTypePointer_StorageUniform16(const Instruction *)"
                 );
  }
  uVar3 = Instruction::GetSingleWordInOperand(instruction,0);
  if (uVar3 == 2) {
    feature_manager = IRContext::get_feature_mgr(instruction->context_);
    bVar1 = anon_unknown_0::Has16BitCapability(feature_manager);
    if (bVar1) {
      bVar1 = EnumSet<spv::Capability>::contains
                        (&feature_manager->capabilities_,CapabilityStorageBuffer16BitAccess);
      this = IRContext::get_decoration_mgr(instruction->context_);
      std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
      stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>(&instructions_to_visit);
      local_a0._0_4_ = Instruction::result_id(instruction);
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&instructions_to_visit.c,(uint *)local_a0._M_pod_data);
      this_00 = IRContext::get_def_use_mgr(instruction->context_);
      lVar6 = 0;
LAB_00497278:
      do {
        if (instructions_to_visit.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            instructions_to_visit.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur) {
          std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                    ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &instructions_to_visit);
          return (_Optional_base<spv::Capability,_true,_true>)
                 (_Optional_base<spv::Capability,_true,_true>)(lVar6 << 0x20 | 0x1152);
        }
        puVar4 = instructions_to_visit.c.
                 super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (instructions_to_visit.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            instructions_to_visit.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          puVar4 = instructions_to_visit.c.
                   super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
        }
        this_01 = analysis::DefUseManager::GetDef(this_00,puVar4[-1]);
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&instructions_to_visit.c);
      } while (lVar6 != 0);
      if (bVar1) goto code_r0x004972c0;
      goto LAB_004972d9;
    }
  }
  return (_Optional_base<spv::Capability,_true,_true>)
         (_Optional_payload<spv::Capability,_true,_true,_true>)0x1152;
code_r0x004972c0:
  uVar3 = Instruction::result_id(this_01);
  bVar2 = analysis::DecorationManager::HasDecoration(this,uVar3,BufferBlock);
  if (!bVar2) {
LAB_004972d9:
    bVar2 = anon_unknown_0::is16bitType(this_01);
    if (bVar2) {
      lVar6 = 1;
    }
    else {
      uVar5 = (ulong)this_01->opcode_;
      if (uVar5 < 0x21) {
        if ((0x31800000UL >> (uVar5 & 0x3f) & 1) == 0) {
          if (uVar5 == 0x1e) {
            local_a0._8_8_ = 0;
            local_88 = std::
                       _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:91:30)>
                       ::_M_invoke;
            local_90 = std::
                       _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:91:30)>
                       ::_M_manager;
            local_a0._M_unused._0_8_ = (undefined8)&instructions_to_visit;
            Instruction::ForEachInOperand
                      (this_01,(function<void_(const_unsigned_int_*)> *)&local_a0);
            if (local_90 != (code *)0x0) {
              (*local_90)(&local_a0,&local_a0,__destroy_functor);
            }
            goto LAB_00497278;
          }
          if (uVar5 != 0x20) goto LAB_00497278;
          uVar3 = 1;
        }
        else {
          uVar3 = 0;
        }
        uVar3 = Instruction::GetSingleWordInOperand(this_01,uVar3);
        local_a0._0_4_ = uVar3;
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&instructions_to_visit.c,(uint *)local_a0._M_pod_data);
      }
    }
  }
  goto LAB_00497278;
}

Assistant:

static std::optional<spv::Capability> Handler_OpTypePointer_StorageUniform16(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpTypePointer &&
         "This handler only support OpTypePointer opcodes.");

  // This capability is only required if the variable has a Uniform storage
  // class.
  spv::StorageClass storage_class = spv::StorageClass(
      instruction->GetSingleWordInOperand(kOpTypePointerStorageClassIndex));
  if (storage_class != spv::StorageClass::Uniform) {
    return std::nullopt;
  }

  const auto* feature_manager = instruction->context()->get_feature_mgr();
  if (!Has16BitCapability(feature_manager)) {
    return std::nullopt;
  }

  const bool hasBufferBlockCapability =
      feature_manager->GetCapabilities().contains(
          spv::Capability::StorageUniformBufferBlock16);
  const auto* decoration_mgr = instruction->context()->get_decoration_mgr();
  bool found16bitType = false;

  DFSWhile(instruction, [decoration_mgr, hasBufferBlockCapability,
                         &found16bitType](const Instruction* item) {
    if (found16bitType) {
      return false;
    }

    if (hasBufferBlockCapability &&
        decoration_mgr->HasDecoration(item->result_id(),
                                      spv::Decoration::BufferBlock)) {
      return false;
    }

    if (is16bitType(item)) {
      found16bitType = true;
      return false;
    }

    return true;
  });

  return found16bitType ? std::optional(spv::Capability::StorageUniform16)
                        : std::nullopt;
}